

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qAverageColor.cpp
# Opt level: O0

uint32_t qAverageColorRGBA8(uint32_t *Pixels,size_t Count)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong in_RSI;
  long in_RDI;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [32];
  uint32_t CurColor;
  uint64_t AlphaSum64;
  uint64_t BlueSum64;
  uint64_t GreenSum64;
  uint64_t RedSum64;
  __m128i QuadPixel;
  size_t j_2;
  __m128i RedGreenSum64;
  __m128i BlueAlphaSum64;
  __m256i Deinterleave_1;
  __m256i OctaPixel;
  size_t j_1;
  __m256i RGBASum64;
  __m512i Deinterleave;
  __m512i HexadecaPixel;
  size_t k;
  __m512i RGBASum32x4;
  size_t j;
  __m512i RGBASum64x2;
  size_t i;
  ulong local_c60;
  ulong local_c58;
  ulong local_c50;
  ulong local_c48;
  ulong local_c28;
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  ulong local_ba8;
  undefined1 local_ba0 [32];
  ulong local_ac8;
  undefined1 local_ac0 [64];
  ulong local_a48;
  undefined1 local_a40 [64];
  ulong local_9d8;
  undefined1 local_300 [16];
  undefined8 uStack_250;
  undefined8 uStack_248;
  
  local_9d8 = 0;
  auVar6 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auVar6 = vmovdqa64_avx512f(auVar6);
  local_a40 = vmovdqa64_avx512f(auVar6);
  for (local_a48 = 0; local_a48 < in_RSI >> 4; local_a48 = local_a48 + 1) {
    auVar6 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    auVar6 = vmovdqa64_avx512f(auVar6);
    local_ac0 = vmovdqa64_avx512f(auVar6);
    for (local_ac8 = 0; local_ac8 < 0x404040 && local_a48 < in_RSI >> 4; local_ac8 = local_ac8 + 1)
    {
      auVar6 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9d8 * 4));
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar8 = vmovdqa64_avx512f(auVar6);
      auVar2 = vpinsrd_avx(ZEXT416(0x2e2a2622),0x3e3a3632,1);
      auVar2 = vpinsrd_avx(auVar2,0x2f2b2723,2);
      auVar2 = vpinsrd_avx(auVar2,0x3f3b3733,3);
      auVar3 = vpinsrd_avx(ZEXT416(0x2c282420),0x3c383430,1);
      auVar3 = vpinsrd_avx(auVar3,0x2d292521,2);
      auVar3 = vpinsrd_avx(auVar3,0x3d393531,3);
      auVar10._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
      auVar10._16_16_ = ZEXT116(1) * auVar2;
      auVar2 = vpinsrd_avx(ZEXT416(0xe0a0602),0x1e1a1612,1);
      auVar2 = vpinsrd_avx(auVar2,0xf0b0703,2);
      auVar2 = vpinsrd_avx(auVar2,0x1f1b1713,3);
      auVar3 = vpinsrd_avx(ZEXT416(0xc080400),0x1c181410,1);
      auVar3 = vpinsrd_avx(auVar3,0xd090501,2);
      auVar3 = vpinsrd_avx(auVar3,0x1d191511,3);
      auVar6 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar2,
                                              ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3)),auVar10,1)
      ;
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar9 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar9);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar6 = vpshufb_avx512bw(auVar6,auVar8);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar8 = vmovdqa64_avx512f(local_ac0);
      auVar9 = vmovdqa64_avx512f(auVar6);
      auVar6 = vpbroadcastb_avx512bw(ZEXT116(1));
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar7 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar7);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar6 = vpdpbusd_avx512_vnni(auVar6,auVar8,auVar9);
      local_ac0 = vmovdqa64_avx512f(auVar6);
      local_a48 = local_a48 + 1;
      local_9d8 = local_9d8 + 0x10;
    }
    auVar8 = vmovdqa64_avx512f(local_a40);
    auVar6 = vmovdqa64_avx512f(local_ac0);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar9 = vpsrlq_avx512f(auVar6,ZEXT416(0x20));
    auVar6 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar9);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar6 = vpaddq_avx512f(auVar6,auVar8);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar8 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(local_ac0);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar9 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar9 = vmovdqa32_avx512f(auVar9);
    auVar7._0_4_ = auVar9._0_4_;
    auVar7._4_4_ = auVar6._4_4_;
    auVar7._8_4_ = auVar9._8_4_;
    auVar7._12_4_ = auVar6._12_4_;
    auVar7._16_4_ = auVar9._16_4_;
    auVar7._20_4_ = auVar6._20_4_;
    auVar7._24_4_ = auVar9._24_4_;
    auVar7._28_4_ = auVar6._28_4_;
    auVar7._32_4_ = auVar9._32_4_;
    auVar7._36_4_ = auVar6._36_4_;
    auVar7._40_4_ = auVar9._40_4_;
    auVar7._44_4_ = auVar6._44_4_;
    auVar7._48_4_ = auVar9._48_4_;
    auVar7._52_4_ = auVar6._52_4_;
    auVar7._56_4_ = auVar9._56_4_;
    auVar7._60_4_ = auVar6._60_4_;
    auVar6 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar7);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpaddq_avx512f(auVar6,auVar8);
    local_a40 = vmovdqa64_avx512f(auVar6);
    local_9d8 = local_9d8 + 0x10;
  }
  auVar6 = vmovdqa64_avx512f(local_a40);
  auVar6 = vmovdqa64_avx512f(auVar6);
  local_ba0 = vpaddq_avx2(auVar6._0_32_,local_a40._32_32_);
  for (local_ba8 = local_9d8 >> 3; local_ba8 < in_RSI >> 3; local_ba8 = local_ba8 + 1) {
    auVar2 = vpinsrb_avx(ZEXT116(0),4,1);
    auVar2 = vpinsrb_avx(auVar2,8,2);
    auVar2 = vpinsrb_avx(auVar2,0xc,3);
    auVar2 = vpinsrb_avx(auVar2,1,4);
    auVar2 = vpinsrb_avx(auVar2,5,5);
    auVar2 = vpinsrb_avx(auVar2,9,6);
    auVar2 = vpinsrb_avx(auVar2,0xd,7);
    auVar2 = vpinsrb_avx(auVar2,2,8);
    auVar2 = vpinsrb_avx(auVar2,6,9);
    auVar2 = vpinsrb_avx(auVar2,10,10);
    auVar2 = vpinsrb_avx(auVar2,0xe,0xb);
    auVar2 = vpinsrb_avx(auVar2,3,0xc);
    auVar2 = vpinsrb_avx(auVar2,7,0xd);
    auVar2 = vpinsrb_avx(auVar2,0xb,0xe);
    vpinsrb_avx(auVar2,0xf,0xf);
    auVar4._16_8_ = local_300._0_8_;
    auVar4._0_16_ = local_300;
    auVar4._24_8_ = local_300._8_8_;
    auVar10 = vpshufb_avx2(*(undefined1 (*) [32])(in_RDI + local_9d8 * 4),auVar4);
    auVar2 = vpinsrd_avx(ZEXT416(0),4,1);
    auVar2 = vpinsrd_avx(auVar2,1,2);
    auVar2 = vpinsrd_avx(auVar2,5,3);
    auVar3 = vpinsrd_avx(ZEXT416(2),6,1);
    auVar3 = vpinsrd_avx(auVar3,3,2);
    auVar3 = vpinsrd_avx(auVar3,7,3);
    uStack_250 = auVar3._0_8_;
    uStack_248 = auVar3._8_8_;
    auVar5._16_8_ = uStack_250;
    auVar5._0_16_ = auVar2;
    auVar5._24_8_ = uStack_248;
    auVar10 = vpermd_avx2(auVar5,auVar10);
    auVar10 = vpsadbw_avx2(auVar10,ZEXT1632(ZEXT816(0)));
    local_ba0 = vpaddq_avx2(local_ba0,auVar10);
    local_9d8 = local_9d8 + 8;
  }
  local_c10 = local_ba0._16_16_;
  local_c20 = local_ba0._0_16_;
  local_c28 = local_9d8 >> 2;
  while( true ) {
    if (in_RSI >> 2 <= local_c28) break;
    auVar2 = vmovntdqa_avx(*(undefined1 (*) [16])(in_RDI + local_9d8 * 4));
    auVar3 = vpinsrb_avx(ZEXT116(0),0xff,1);
    auVar3 = vpinsrb_avx(auVar3,8,2);
    auVar3 = vpinsrb_avx(auVar3,0xff,3);
    auVar3 = vpinsrb_avx(auVar3,4,4);
    auVar3 = vpinsrb_avx(auVar3,0xff,5);
    auVar3 = vpinsrb_avx(auVar3,0xc,6);
    auVar3 = vpinsrb_avx(auVar3,0xff,7);
    auVar3 = vpinsrb_avx(auVar3,1,8);
    auVar3 = vpinsrb_avx(auVar3,0xff,9);
    auVar3 = vpinsrb_avx(auVar3,9,10);
    auVar3 = vpinsrb_avx(auVar3,0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,5,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,0xd,0xe);
    auVar3 = vpinsrb_avx(auVar3,0xff,0xf);
    auVar3 = vpshufb_avx(auVar2,auVar3);
    auVar3 = vpsadbw_avx(auVar3,ZEXT816(0));
    local_c20 = vpaddq_avx(local_c20,auVar3);
    auVar3 = vpinsrb_avx(ZEXT116(2),0xff,1);
    auVar3 = vpinsrb_avx(auVar3,10,2);
    auVar3 = vpinsrb_avx(auVar3,0xff,3);
    auVar3 = vpinsrb_avx(auVar3,6,4);
    auVar3 = vpinsrb_avx(auVar3,0xff,5);
    auVar3 = vpinsrb_avx(auVar3,0xe,6);
    auVar3 = vpinsrb_avx(auVar3,0xff,7);
    auVar3 = vpinsrb_avx(auVar3,3,8);
    auVar3 = vpinsrb_avx(auVar3,0xff,9);
    auVar3 = vpinsrb_avx(auVar3,0xb,10);
    auVar3 = vpinsrb_avx(auVar3,0xff,0xb);
    auVar3 = vpinsrb_avx(auVar3,7,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xff,0xd);
    auVar3 = vpinsrb_avx(auVar3,0xf,0xe);
    auVar3 = vpinsrb_avx(auVar3,0xff,0xf);
    auVar2 = vpshufb_avx(auVar2,auVar3);
    auVar2 = vpsadbw_avx(auVar2,ZEXT816(0));
    local_c10 = vpaddq_avx(local_c10,auVar2);
    local_c28 = local_c28 + 1;
    local_9d8 = local_9d8 + 4;
  }
  local_c48 = local_c20._0_8_;
  local_c50 = local_c20._8_8_;
  local_c58 = local_c10._0_8_;
  local_c60 = local_c10._8_8_;
  for (; local_9d8 < in_RSI; local_9d8 = local_9d8 + 1) {
    uVar1 = *(uint *)(in_RDI + local_9d8 * 4);
    local_c60 = (uVar1 >> 0x18) + local_c60;
    local_c58 = ((ulong)(uVar1 >> 0x10) & 0xff) + local_c58;
    local_c50 = (uVar1 >> 8 & 0xff) + local_c50;
    local_c48 = (uVar1 & 0xff) + local_c48;
  }
  return (int)(local_c60 / in_RSI) << 0x18 | ((uint)(local_c58 / in_RSI) & 0xff) << 0x10 |
         ((uint)(local_c50 / in_RSI) & 0xff) << 8 | (uint)(local_c48 / in_RSI) & 0xff;
}

Assistant:

std::uint32_t qAverageColorRGBA8(
	const std::uint32_t Pixels[],
	std::size_t Count
)
{
	std::size_t i = 0;

#if defined(__AVX512VNNI__) || defined(_MSC_VER)
	// 16 pixels at a time! (AVX512)
	// | ASum64 | BSum64 | GSum64 | RSum64 | ASum64 | BSum64 | GSum64 | RSum64 |
	__m512i RGBASum64x2  = _mm512_setzero_si512();
	for( std::size_t j = i/16; j < Count/16; j++, i += 16 )
	{
		// 32-bit accumulators
		__m512i RGBASum32x4 = _mm512_setzero_si512();
		// In the worst case, where all the bytes are just 0xFF:
		// We are horizontally summing 4 channel-bytes at a time into a 32-bit
		// accumulator. The 32-bit accumulator would overflow after-
		// ( (0xFFFFFFFF / ( 0xFF * 4 ) ) = >>> 0x404040 iterations <<<
		//       ^             ^    ^ Number of bytes summed into accumulator
		//       |             |      at each iteration
		//       |             | a saturated channel bytechannel
		//       | a saturated register is made out of...
		#define SPANDOT4 (0xFFFFFFFF / ( 0xFF * 4 ) )
		for(
			std::size_t k = 0;
			(k < SPANDOT4) && (j < Count/16);
			k++, j++, i += 16
		)
		{
		#undef SPANDOT4
			const __m512i HexadecaPixel = _mm512_loadu_si512((__m512i*)&Pixels[i]);
			// Setting up for vpdpbusd
			__m512i Deinterleave = _mm512_shuffle_epi8(
				HexadecaPixel,
				_mm512_set_epi32(
					// Alpha
					0x3C'38'34'30 + 0x03'03'03'03, 0x2C'28'24'20 + 0x03'03'03'03,
					// Blue
					0x3C'38'34'30 + 0x02'02'02'02, 0x2C'28'24'20 + 0x02'02'02'02,
					// Green
					0x3C'38'34'30 + 0x01'01'01'01, 0x2C'28'24'20 + 0x01'01'01'01,
					// Red
					0x3C'38'34'30 + 0x00'00'00'00, 0x2C'28'24'20 + 0x00'00'00'00,
					// Alpha
					0x1C'18'14'10 + 0x03'03'03'03, 0x0C'08'04'00 + 0x03'03'03'03,
					// Blue
					0x1C'18'14'10 + 0x02'02'02'02, 0x0C'08'04'00 + 0x02'02'02'02,
					// Green
					0x1C'18'14'10 + 0x01'01'01'01, 0x0C'08'04'00 + 0x01'01'01'01,
					// Red
					0x1C'18'14'10 + 0x00'00'00'00, 0x0C'08'04'00 + 0x00'00'00'00
				)
			);
			// VNNI: basically an does a R^4 dot product to each group of
			// 4 bytes into a 32-bit accumulator

			// Dest = Dest + (a[i + 0] * b[i + 0])
			//             + (a[i + 1] * b[i + 1])
			//             + (a[i + 2] * b[i + 2])
			//             + (a[i + 3] * b[i + 3])
			// Dest += + (a[i + 0] * 1)
			//         + (a[i + 1] * 1)
			//         + (a[i + 2] * 1)
			//         + (a[i + 3] * 1)
			// | AAAA | AAAA | BBBB | BBBB | GGGG | GGGG | RRRR | RRRR |
			// | **** | **** | **** | **** | **** | **** | **** | **** |
			// | 1111 | 1111 | 1111 | 1111 | 1111 | 1111 | 1111 | 1111 | x2
			// | hadd | hadd | hadd | hadd | hadd | hadd | hadd | hadd |
			// |ASum32|ASum32|BSum32|BSum32|GSum32|GSum32|RSum32|RSum32|
			RGBASum32x4 = _mm512_dpbusd_epi32(
				RGBASum32x4, Deinterleave, _mm512_set1_epi8(1)
			);
		}
		// Upper Sum32s
		RGBASum64x2 = _mm512_add_epi64(
			RGBASum64x2,
			_mm512_srli_epi64(RGBASum32x4, 32)
		);
		// Lower Sum32s
		RGBASum64x2 = _mm512_add_epi64(
			RGBASum64x2,
			_mm512_maskz_mov_epi32(_cvtu32_mask16(0b0101010101010101), RGBASum32x4)
		);
	}

	// | ASum64 | BSum64 | GSum64 | RSum64 |
	__m256i RGBASum64  = _mm256_add_epi64(
		_mm512_castsi512_si256(RGBASum64x2),
		_mm512_extracti64x4_epi64(RGBASum64x2,1)
	);
#elif defined(__AVX512F__)
	// 16 pixels at a time! (AVX512)
	// | ASum64 | BSum64 | GSum64 | RSum64 | ASum64 | BSum64 | GSum64 | RSum64 |
	__m512i RGBASum64x2  = _mm512_setzero_si512();
	for( std::size_t j = i/16; j < Count/16; j++, i += 16 )
	{
		const __m512i HexadecaPixel = _mm512_loadu_si512((__m512i*)&Pixels[i]);
		// | AAAAAAAA | BBBBBBBB | GGGGGGGG | RRRRRRRR | x2
		// Setting up for 64-bit lane sad_epu8
		__m512i Deinterleave = _mm512_shuffle_epi8(
			HexadecaPixel,
			_mm512_set_epi32(
				// Alpha
				0x3C'38'34'30 + 0x03'03'03'03, 0x2C'28'24'20 + 0x03'03'03'03,
				// Blue
				0x3C'38'34'30 + 0x02'02'02'02, 0x2C'28'24'20 + 0x02'02'02'02,
				// Green
				0x3C'38'34'30 + 0x01'01'01'01, 0x2C'28'24'20 + 0x01'01'01'01,
				// Red
				0x3C'38'34'30 + 0x00'00'00'00, 0x2C'28'24'20 + 0x00'00'00'00,
				// Alpha
				0x1C'18'14'10 + 0x03'03'03'03, 0x0C'08'04'00 + 0x03'03'03'03,
				// Blue
				0x1C'18'14'10 + 0x02'02'02'02, 0x0C'08'04'00 + 0x02'02'02'02,
				// Green
				0x1C'18'14'10 + 0x01'01'01'01, 0x0C'08'04'00 + 0x01'01'01'01,
				// Red
				0x1C'18'14'10 + 0x00'00'00'00, 0x0C'08'04'00 + 0x00'00'00'00
			)
		);
		// | ASum64 | BSum64 | GSum64 | RSum64 |
		RGBASum64x2 = _mm512_add_epi64(
			RGBASum64x2,
			_mm512_sad_epu8(
				Deinterleave,
				_mm512_setzero_si512()
			)
		);
	}

	// | ASum64 | BSum64 | GSum64 | RSum64 |
	__m256i RGBASum64  = _mm256_add_epi64(
		_mm512_castsi512_si256(RGBASum64x2),
		_mm512_extracti64x4_epi64(RGBASum64x2,1)
	);
#else
	__m256i RGBASum64  = _mm256_setzero_si256();
#endif
	// 8 pixels at a time! (AVX/AVX2)
	for( std::size_t j = i/8; j < Count/8; j++, i += 8 )
	{
		const __m256i OctaPixel = _mm256_loadu_si256((__m256i*)&Pixels[i]);
		// Shuffle within 128-bit lanes
		// | ABGRABGRABGRABGR | ABGRABGRABGRABGR |
		// | AAAABBBBGGGGRRRR | AAAABBBBGGGGRRRR |
		// Setting up for 64-bit lane sad_epu8
		__m256i Deinterleave = _mm256_shuffle_epi8(
			OctaPixel,
			_mm256_broadcastsi128_si256(
				_mm_set_epi8(
					// Alpha
					15,11, 7, 3,
					// Blue
					14,10, 6, 2,
					// Green
					13, 9, 5, 1,
					// Red
					12, 8, 4, 0
				)
			)
		);
		// Cross-lane shuffle
		// | AAAABBBBGGGGRRRR | AAAABBBBGGGGRRRR |
		// | AAAAAAAA | BBBBBBBB | GGGGGGGG | RRRRRRRR |
		Deinterleave = _mm256_permutevar8x32_epi32(
			Deinterleave,
			_mm256_set_epi32(
				// Alpha
				7, 3,
				// Blue
				6, 2,
				// Green
				5, 1,
				// Red
				4, 0
			)
		);
		// | ASum64 | BSum64 | GSum64 | RSum64 |
		RGBASum64 = _mm256_add_epi64(
			RGBASum64,
			_mm256_sad_epu8(
				Deinterleave,
				_mm256_setzero_si256()
			)
		);
	}

	// 4 pixels at a time! (SSE)
	__m128i BlueAlphaSum64  = _mm256_extractf128_si256(RGBASum64,1);
	__m128i RedGreenSum64 = _mm256_castsi256_si128(RGBASum64);
	for( std::size_t j = i/4; j < Count/4; j++, i += 4 )
	{
		const __m128i QuadPixel = _mm_stream_load_si128((__m128i*)&Pixels[i]);
		// | GGGGGGGG | RRRRRRRR | GGGGGGGG | RRRRRRRR |
		RedGreenSum64 = _mm_add_epi64(
			RedGreenSum64,
			_mm_sad_epu8(
				_mm_shuffle_epi8(
					QuadPixel,
					_mm_set_epi8(
						// Green
						-1,13,-1, 5,
						-1, 9,-1, 1,
						// Red
						-1,12,-1, 4,
						-1, 8,-1, 0
					)
				),
				_mm_setzero_si128()
			)
		);
		// | AAAAAAAA | BBBBBBBB | AAAAAAAA | BBBBBBBB |
		BlueAlphaSum64 = _mm_add_epi64(
			BlueAlphaSum64,
			_mm_sad_epu8(
				_mm_shuffle_epi8(
					QuadPixel,
					_mm_set_epi8(
						// Alpha
						-1,15,-1, 7,
						-1,11,-1, 3,
						// Blue
						-1,14,-1, 6,
						-1,10,-1, 2
					)
				),
				_mm_setzero_si128()
			)
		);
	}

	// Horizontal sum into just one 64-bit sum now
	std::uint64_t RedSum64 = _mm_cvtsi128_si64(RedGreenSum64);
	std::uint64_t GreenSum64   = _mm_extract_epi64(RedGreenSum64,1);
	std::uint64_t BlueSum64 = _mm_cvtsi128_si64(BlueAlphaSum64);
	std::uint64_t AlphaSum64  = _mm_extract_epi64(BlueAlphaSum64,1);

	// Serial
	for( ; i < Count; ++i )
	{
		const std::uint32_t CurColor = Pixels[i];
		AlphaSum64 += _bextr_u64( CurColor, 24, 8);
		BlueSum64  += _bextr_u64( CurColor, 16, 8);
		// I'm being oddly specific here to make it obvious for the
		// compiler to do some ah/bh/ch/dh register trickery
		//                                              V
		GreenSum64 += static_cast<std::uint8_t>( CurColor >>  8 );
		RedSum64   += static_cast<std::uint8_t>( CurColor       );
	}

	// Average
	RedSum64   /= Count;
	GreenSum64 /= Count;
	BlueSum64  /= Count;
	AlphaSum64 /= Count;

	// Interleave
	return
		(static_cast<std::uint32_t>( (std::uint8_t)AlphaSum64 ) << 24 ) |
		(static_cast<std::uint32_t>( (std::uint8_t) BlueSum64 ) << 16 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)GreenSum64 ) <<  8 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)  RedSum64 ) <<  0 );
}